

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::solve_inequality
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *this)

{
  pointer *ppnVar1;
  longdouble lVar2;
  int iVar3;
  uint uVar4;
  pointer pnVar5;
  pointer pcVar6;
  longdouble lVar7;
  pointer piVar8;
  ptrdiff_t _Num;
  long lVar9;
  ulong uVar10;
  longdouble lVar11;
  
  piVar8 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->items).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)piVar8;
  this->lower_bound = (longdouble)INFINITY;
  lVar11 = (longdouble)0;
  if (lVar9 != 0) {
    lVar9 = (lVar9 >> 4) * -0x5555555555555555;
    lVar7 = (longdouble)0;
    lVar11 = lVar7;
    do {
      lVar2 = piVar8->r;
      if (lVar2 <= lVar7 || lVar7 != lVar2) {
        lVar11 = lVar2 + lVar11;
      }
      piVar8 = piVar8 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  this->upper_bound = lVar11;
  make_init_node_0(this);
  pnVar5 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = pnVar5[-1].sumfactor;
  if ((iVar3 < this->b_min) || (this->b_max < iVar3)) {
    if (this->b_max < iVar3) {
      uVar4 = pnVar5[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar4);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar4) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar4;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar5[-1].sumr;
    uVar10 = (ulong)(this->subvector).m_element_size;
    if (uVar10 != 0) {
      pcVar6 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar6 + this->solution,pcVar6 + pnVar5[-1].variables,uVar10);
    }
  }
  make_init_node_1(this);
  pnVar5 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = pnVar5[-1].sumfactor;
  if ((iVar3 < this->b_min) || (this->b_max < iVar3)) {
    if (this->b_max < iVar3) {
      uVar4 = pnVar5[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar4);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar4) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar4;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar5[-1].sumr;
    uVar10 = (ulong)(this->subvector).m_element_size;
    if (uVar10 != 0) {
      pcVar6 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar6 + this->solution,pcVar6 + pnVar5[-1].variables,uVar10);
    }
  }
  while ((this->nodes).
         super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->nodes).
         super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    make_next_inequality_node(this);
  }
  return;
}

Assistant:

void solve_inequality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        make_init_node_1();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_inequality_node();
    }